

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::SerializeWithCachedSizes
          (VisionFeaturePrint_Objects *this,CodedOutputStream *output)

{
  VisionFeaturePrint_Objects_ObjectsVersion VVar1;
  int iVar2;
  int size;
  char *data;
  string *value;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  VisionFeaturePrint_Objects *this_local;
  
  VVar1 = version(this);
  if (VVar1 != VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_INVALID) {
    VVar1 = version(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,VVar1,output);
  }
  local_20 = 0;
  iVar2 = output_size(this);
  for (; local_20 < iVar2; local_20 = local_20 + 1) {
    output_abi_cxx11_(this,local_20);
    data = (char *)std::__cxx11::string::data();
    output_abi_cxx11_(this,local_20);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,
               "CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output");
    value = output_abi_cxx11_(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteString(100,value,output);
  }
  return;
}

Assistant:

void VisionFeaturePrint_Objects::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.ObjectsVersion version = 1;
  if (this->version() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->version(), output);
  }

  // repeated string output = 100;
  for (int i = 0, n = this->output_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->output(i).data(), this->output(i).length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      100, this->output(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
}